

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O3

bool __thiscall ON_NurbsSurface::IsPlanar(ON_NurbsSurface *this,ON_Plane *plane,double tolerance)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  ON_Plane *pOVar6;
  ON_3dVector *this_00;
  int i;
  byte bVar7;
  double dVar8;
  double dVar9;
  ON_3dVector normal;
  ON_Interval vdom;
  ON_Interval udom;
  ON_3dVector dv;
  ON_3dVector du;
  ON_3dPoint center;
  ON_3dPoint cv;
  ON_3dVector local_160;
  ON_Plane local_148;
  ON_3dVector local_c8;
  ON_Interval local_b0;
  ON_Interval local_a0;
  ON_3dVector local_90;
  ON_3dVector local_78;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  bVar7 = 0;
  ON_Plane::ON_Plane(&local_148);
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this,0);
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this,1);
  dVar8 = ON_Interval::ParameterAt(&local_a0,0.5);
  dVar9 = ON_Interval::ParameterAt(&local_b0,0.5);
  bVar1 = ON_Surface::EvNormal
                    (&this->super_ON_Surface,dVar8,dVar9,&local_60,&local_78,&local_90,&local_c8,0,
                     (int *)0x0);
  if (bVar1) {
    dVar8 = ON_3dVector::Length(&local_c8);
    if (dVar8 < 0.9) {
      bVar1 = false;
      goto LAB_005455d3;
    }
  }
  local_148.origin.z = local_60.z;
  local_148.origin.x = local_60.x;
  local_148.origin.y = local_60.y;
  local_148.zaxis.x = local_c8.x;
  local_148.zaxis.y = local_c8.y;
  local_148.zaxis.z = local_c8.z;
  bVar2 = ON_3dVector::Unitize(&local_78);
  if (bVar2) {
    local_148.xaxis.z = local_78.z;
    local_148.xaxis.x = local_78.x;
    local_148.xaxis.y = local_78.y;
    ON_CrossProduct(&local_160,&local_148.zaxis,&local_148.xaxis);
    this_00 = &local_148.yaxis;
    local_148.yaxis.z = local_160.z;
    local_148.yaxis.x = local_160.x;
    local_148.yaxis.y = local_160.y;
LAB_00545357:
    ON_3dVector::Unitize(this_00);
    ON_Plane::UpdateEquation(&local_148);
  }
  else {
    bVar2 = ON_3dVector::Unitize(&local_90);
    if (bVar2) {
      local_148.yaxis.z = local_90.z;
      local_148.yaxis.x = local_90.x;
      local_148.yaxis.y = local_90.y;
      ON_CrossProduct(&local_160,&local_148.yaxis,&local_148.zaxis);
      this_00 = &local_148.xaxis;
      local_148.xaxis.z = local_160.z;
      local_148.xaxis.x = local_160.x;
      local_148.xaxis.y = local_160.y;
      goto LAB_00545357;
    }
    ON_Plane::CreateFromNormal(&local_148,&local_60,&local_c8);
  }
  dVar9 = ABS(local_148.zaxis.x);
  dVar8 = ABS(local_148.zaxis.y);
  if (((2.3283064365386963e-10 < dVar9) || (2.3283064365386963e-10 < dVar8)) ||
     (1.490116119385e-08 < ABS(ABS(local_148.zaxis.z) + -1.0))) {
    if (((dVar8 <= 2.3283064365386963e-10) && (ABS(local_148.zaxis.z) <= 2.3283064365386963e-10)) &&
       (ABS(dVar9 + -1.0) <= 1.490116119385e-08)) {
      local_148.xaxis.x = 0.0;
      local_148.yaxis.x = 0.0;
      local_148.zaxis.x = *(double *)(&DAT_006994c0 + (ulong)(local_148.zaxis.x < 0.0) * 8);
      local_148.zaxis.y = 0.0;
      local_148.zaxis.z = 0.0;
      goto LAB_00545517;
    }
    if (((dVar9 <= 2.3283064365386963e-10) && (ABS(local_148.zaxis.z) <= 2.3283064365386963e-10)) &&
       (ABS(dVar8 + -1.0) <= 1.490116119385e-08)) {
      local_148.xaxis.y = 0.0;
      local_148.yaxis.y = 0.0;
      local_148.zaxis.z = 0.0;
      local_148.zaxis.x = 0.0;
      local_148.zaxis.y = *(double *)(&DAT_006994c0 + (ulong)(local_148.zaxis.y < 0.0) * 8);
      goto LAB_00545517;
    }
  }
  else {
    local_148.xaxis.z = 0.0;
    local_148.zaxis.z = *(double *)(&DAT_006994c0 + (ulong)(local_148.zaxis.z < 0.0) * 8);
    local_148.yaxis.z = 0.0;
    local_148.zaxis.x = 0.0;
    local_148.zaxis.y = 0.0;
LAB_00545517:
    ON_Plane::UpdateEquation(&local_148);
  }
  iVar5 = this->m_cv_count[0];
  if (bVar1 && 0 < iVar5) {
    iVar3 = this->m_cv_count[1];
    i = 0;
    do {
      if ((0 < iVar3) && (bVar1 != false)) {
        iVar5 = 1;
        do {
          GetCV(this,i,iVar5 + -1,&local_48);
          dVar8 = ON_Plane::DistanceTo(&local_148,&local_48);
          if (tolerance < ABS(dVar8)) {
            bVar1 = false;
          }
          iVar3 = this->m_cv_count[1];
        } while ((iVar5 < iVar3) && (iVar5 = iVar5 + 1, bVar1 != false));
        iVar5 = this->m_cv_count[0];
      }
      i = i + 1;
    } while ((i < iVar5) && (bVar1 != false));
  }
  if ((plane != (ON_Plane *)0x0) && (bVar1 != false)) {
    pOVar6 = &local_148;
    for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
      (plane->origin).x = (pOVar6->origin).x;
      pOVar6 = (ON_Plane *)((long)pOVar6 + ((ulong)bVar7 * -2 + 1) * 8);
      plane = (ON_Plane *)((long)plane + (ulong)bVar7 * -0x10 + 8);
    }
    bVar1 = true;
  }
LAB_005455d3:
  ON_Plane::~ON_Plane(&local_148);
  return bVar1;
}

Assistant:

bool ON_NurbsSurface::IsPlanar(
      ON_Plane* plane,
      double tolerance
      ) const
{
  ON_Plane pln;
  double d;
  ON_3dPoint center, cv;
  ON_3dVector normal, du, dv;
  ON_Interval udom = Domain(0);
  ON_Interval vdom = Domain(1);
  bool rc = EvNormal( udom.ParameterAt(0.5), vdom.ParameterAt(0.5), center, du, dv, normal );
  if ( rc && normal.Length() < 0.9 )
    rc = false;
  else
  {
    pln.origin = center;
    pln.zaxis = normal;
    if ( du.Unitize() )
    {
      pln.xaxis = du;
      pln.yaxis = ON_CrossProduct( pln.zaxis, pln.xaxis );
      pln.yaxis.Unitize();
      pln.UpdateEquation();
    }
    else if ( dv.Unitize() )
    {
      pln.yaxis = dv;
      pln.xaxis = ON_CrossProduct( pln.yaxis, pln.zaxis );
      pln.xaxis.Unitize();
      pln.UpdateEquation();
    }
    else
    {
      pln.CreateFromNormal( center, normal );
    }

    // 7 July 2006 Dale Lear
    //    Add a slight bias for coordinate axes planes.
    //    This appears to do more good than harm.  The
    //    issue is keeping customers from getting alarmed
    //    when a coordinate they know is "zero" turns out to
    //    be 1e-23.
    if (    fabs(pln.zaxis.x) <= ON_ZERO_TOLERANCE 
         && fabs(pln.zaxis.y) <= ON_ZERO_TOLERANCE
         && fabs(fabs(pln.zaxis.z)-1.0) <= ON_SQRT_EPSILON
       )
    {
      pln.xaxis.z = 0.0;
      pln.yaxis.z = 0.0;
      pln.zaxis.x = 0.0;
      pln.zaxis.y = 0.0;
      pln.zaxis.z = (pln.zaxis.z<0.0) ? -1.0 : 1.0;
      pln.UpdateEquation();
    }
    else if (    fabs(pln.zaxis.y) <= ON_ZERO_TOLERANCE 
              && fabs(pln.zaxis.z) <= ON_ZERO_TOLERANCE
              && fabs(fabs(pln.zaxis.x)-1.0) <= ON_SQRT_EPSILON
            )
    {
      pln.xaxis.x = 0.0;
      pln.yaxis.x = 0.0;
      pln.zaxis.y = 0.0;
      pln.zaxis.z = 0.0;
      pln.zaxis.x = (pln.zaxis.x<0.0) ? -1.0 : 1.0;
      pln.UpdateEquation();
    }
    else if (    fabs(pln.zaxis.z) <= ON_ZERO_TOLERANCE 
              && fabs(pln.zaxis.x) <= ON_ZERO_TOLERANCE
              && fabs(fabs(pln.zaxis.y)-1.0) <= ON_SQRT_EPSILON
            )
    {
      pln.xaxis.y = 0.0;
      pln.yaxis.y = 0.0;
      pln.zaxis.z = 0.0;
      pln.zaxis.x = 0.0;
      pln.zaxis.y = (pln.zaxis.y<0.0) ? -1.0 : 1.0;
      pln.UpdateEquation();
    }

    int i, j;
    for ( i = 0; i < m_cv_count[0] && rc; i++ )
    {
      for ( j = 0; j < m_cv_count[1] && rc; j++ )
      {
        GetCV( i, j, cv );
        d = pln.DistanceTo(cv);
        if ( fabs(d) > tolerance )
          rc = false;
      }
    }

    if ( rc && plane )
      *plane = pln;
  }

  return rc;
}